

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h2-proxy.c
# Opt level: O2

CURLcode proxy_h2_progress_egress(Curl_cfilter *cf,Curl_easy *data)

{
  bufq *q;
  byte *pbVar1;
  undefined8 *puVar2;
  void *pvVar3;
  _Bool _Var4;
  int iVar5;
  uint lib_error_code;
  char *pcVar6;
  ssize_t sVar7;
  size_t sVar8;
  CURLcode CVar9;
  CURLcode local_2c;
  
  puVar2 = (undefined8 *)cf->ctx;
  *(byte *)(puVar2 + 0x28) = *(byte *)(puVar2 + 0x28) & 0xfb;
  lib_error_code = 0;
  while (((lib_error_code == 0 && ((*(byte *)(puVar2 + 0x28) & 4) == 0)) &&
         (iVar5 = nghttp2_session_want_write((nghttp2_session *)*puVar2), iVar5 != 0))) {
    lib_error_code = nghttp2_session_send((nghttp2_session *)*puVar2);
  }
  iVar5 = nghttp2_is_fatal(lib_error_code);
  if (iVar5 == 0) {
    pvVar3 = cf->ctx;
    q = (bufq *)((long)pvVar3 + 0x50);
    _Var4 = Curl_bufq_is_empty(q);
    CVar9 = CURLE_OK;
    if (!_Var4) {
      sVar7 = Curl_bufq_pass(q,proxy_h2_nw_out_writer,cf,&local_2c);
      if (sVar7 < 0) {
        CVar9 = local_2c;
        if (local_2c == CURLE_AGAIN) {
          CVar9 = CURLE_AGAIN;
          if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) &&
             (0 < cf->cft->log_level)) {
            sVar8 = Curl_bufq_len(q);
            Curl_trc_cf_infof(data,cf,"[0] flush nw send buffer(%zu) -> EAGAIN",sVar8);
            CVar9 = local_2c;
          }
          pbVar1 = (byte *)((long)pvVar3 + 0x140);
          *pbVar1 = *pbVar1 | 4;
        }
      }
      else {
        if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) &&
           (0 < cf->cft->log_level)) {
          Curl_trc_cf_infof(data,cf,"[0] nw send buffer flushed");
        }
        _Var4 = Curl_bufq_is_empty(q);
        CVar9 = CURLE_AGAIN;
        if (_Var4) {
          CVar9 = CURLE_OK;
        }
      }
    }
  }
  else {
    CVar9 = CURLE_SEND_ERROR;
    if ((((data != (Curl_easy *)0x0) && (cf != (Curl_cfilter *)0x0)) &&
        ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0)) && (0 < cf->cft->log_level)) {
      pcVar6 = nghttp2_strerror(lib_error_code);
      Curl_trc_cf_infof(data,cf,"[0] nghttp2_session_send error (%s)%d",pcVar6,(ulong)lib_error_code
                       );
    }
  }
  return CVar9;
}

Assistant:

static CURLcode proxy_h2_progress_egress(struct Curl_cfilter *cf,
                                         struct Curl_easy *data)
{
  struct cf_h2_proxy_ctx *ctx = cf->ctx;
  int rv = 0;

  ctx->nw_out_blocked = 0;
  while(!rv && !ctx->nw_out_blocked && nghttp2_session_want_write(ctx->h2))
    rv = nghttp2_session_send(ctx->h2);

  if(nghttp2_is_fatal(rv)) {
    CURL_TRC_CF(data, cf, "[0] nghttp2_session_send error (%s)%d",
                nghttp2_strerror(rv), rv);
    return CURLE_SEND_ERROR;
  }
  return proxy_h2_nw_out_flush(cf, data);
}